

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O2

void __thiscall
procxx::pipe_streambuf::pipe_streambuf(pipe_streambuf *this,size_t buffer_size,size_t put_back_size)

{
  pointer pcVar1;
  pointer pcVar2;
  allocator_type local_19;
  
  pipe_ostreambuf::pipe_ostreambuf(&this->super_pipe_ostreambuf,buffer_size,put_back_size);
  *(undefined ***)&this->super_pipe_ostreambuf = &PTR__pipe_streambuf_001673c0;
  pipe_t::pipe_t(&this->stdin_pipe_);
  std::vector<char,_std::allocator<char>_>::vector(&this->out_buffer_,buffer_size + 1,&local_19);
  pcVar1 = (this->out_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->out_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)&(this->super_pipe_ostreambuf).field_0x28 = pcVar1;
  *(pointer *)&(this->super_pipe_ostreambuf).field_0x20 = pcVar1;
  *(pointer *)&(this->super_pipe_ostreambuf).field_0x30 = pcVar2 + -1;
  return;
}

Assistant:

pipe_streambuf(size_t buffer_size = 512, size_t put_back_size = 8)
      : pipe_ostreambuf{buffer_size, put_back_size},
        out_buffer_(buffer_size + 1) {
    auto begin = &out_buffer_.front();
    setp(begin, begin + out_buffer_.size() - 1);
  }